

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.h
# Opt level: O2

bool __thiscall glslang::TSpirvType::operator==(TSpirvType *this,TSpirvType *rhs)

{
  bool bVar1;
  
  bVar1 = TSpirvInstruction::operator==(&this->spirvInst,&rhs->spirvInst);
  if (bVar1) {
    bVar1 = std::operator==(&(this->typeParams).
                             super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                            ,&(rhs->typeParams).
                              super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                           );
    return bVar1;
  }
  return false;
}

Assistant:

bool operator==(const TSpirvType& rhs) const
    {
        return spirvInst == rhs.spirvInst && typeParams == rhs.typeParams;
    }